

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VIP.cpp
# Opt level: O2

void iniVIP(void)

{
  long *plVar1;
  int iVar2;
  int unaff_EBP;
  bool bVar3;
  char a;
  string s;
  stringstream ss;
  ifstream fin;
  ifstream test;
  
  std::ifstream::ifstream(&test,"VIPlist.txt",_S_in);
  while( true ) {
    plVar1 = (long *)std::istream::get((char *)&test);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
    unaff_EBP = unaff_EBP + (uint)(a == '\n');
  }
  std::ifstream::ifstream(&fin,"VIPlist.txt",_S_in);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  iVar2 = 0;
  if (unaff_EBP < 1) {
    unaff_EBP = 0;
  }
  do {
    if (iVar2 == unaff_EBP) {
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::__cxx11::string::~string((string *)&s);
      std::ifstream::~ifstream(&fin);
      std::ifstream::~ifstream(&test);
      return;
    }
    std::__cxx11::string::erase((ulong)&s,0);
    bVar3 = true;
    while( true ) {
      plVar1 = (long *)std::istream::get((char *)&fin);
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
      if (a < '!') {
        if ((a == ' ') || (a == '\n')) {
          if (!bVar3) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&Psws_abi_cxx11_,&s);
            break;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&Names_abi_cxx11_,&s);
          std::__cxx11::string::erase((ulong)&s,0);
          bVar3 = false;
          std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + (int)&ss);
        }
      }
      else {
        std::__cxx11::string::push_back((char)&s);
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void iniVIP() {
    ifstream test("VIPlist.txt");
    int num;
    char a;
    while(test.get(a)){
        if(a == '\n'){
            num++;
        }
    }

    ifstream fin("VIPlist.txt");
    string s;
    stringstream ss;
    int i , j;
    for (i = 0; i < num; i++) {//ϣ��.size���û�������
        j = 0;
        s.erase();
        while (fin.get(a)) {
            if (a > 32) {
                s += a;
            } else if (a == ' ' || a == '\n') {
                switch (j){
                    case 0:
                        Names.push_back(s);
                        break;
                    case 1:
                        Psws.push_back(s);
                }
                j++;
                if(j > 1){
                    break;
                }

                s.erase();
                ss.clear();
            }
        }
    }
    fin.close();
}